

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncFunction.cpp
# Opt level: O0

void __thiscall
Js::JavascriptAsyncSpawnStepFunction::MarkVisitKindSpecificPtrs
          (JavascriptAsyncSpawnStepFunction *this,SnapshotExtractor *extractor)

{
  JavascriptGenerator **ppJVar1;
  void **ppvVar2;
  SnapshotExtractor *extractor_local;
  JavascriptAsyncSpawnStepFunction *this_local;
  
  ppJVar1 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptGenerator__
                      ((WriteBarrierPtr *)&this->generator);
  if (*ppJVar1 != (JavascriptGenerator *)0x0) {
    ppJVar1 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptGenerator__
                        ((WriteBarrierPtr *)&this->generator);
    TTD::SnapshotExtractor::MarkVisitVar(extractor,*ppJVar1);
  }
  ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->reject);
  if (*ppvVar2 != (void *)0x0) {
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->reject);
    TTD::SnapshotExtractor::MarkVisitVar(extractor,*ppvVar2);
  }
  ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->resolve);
  if (*ppvVar2 != (void *)0x0) {
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->resolve);
    TTD::SnapshotExtractor::MarkVisitVar(extractor,*ppvVar2);
  }
  ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->argument);
  if (*ppvVar2 != (void *)0x0) {
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->argument);
    TTD::SnapshotExtractor::MarkVisitVar(extractor,*ppvVar2);
  }
  return;
}

Assistant:

void JavascriptAsyncSpawnStepFunction::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
{
    if (this->generator != nullptr)
    {
        extractor->MarkVisitVar(this->generator);
    }

    if (this->reject != nullptr)
    {
        extractor->MarkVisitVar(this->reject);
    }

    if (this->resolve != nullptr)
    {
        extractor->MarkVisitVar(this->resolve);
    }

    if (this->argument != nullptr)
    {
        extractor->MarkVisitVar(this->argument);
    }
}